

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayView.h
# Opt level: O0

ArrayView<const_Corrade::Utility::JsonToken> __thiscall
Corrade::Containers::ArrayView<const_Corrade::Utility::JsonToken>::slice
          (ArrayView<const_Corrade::Utility::JsonToken> *this,size_t begin,size_t end)

{
  anon_class_24_3_cb5dd4a3 local_48;
  size_t local_30;
  size_t end_local;
  size_t begin_local;
  ArrayView<const_Corrade::Utility::JsonToken> *this_local;
  
  local_30 = end;
  end_local = begin;
  begin_local = (size_t)this;
  if ((end < begin) || (this->_size < end)) {
    local_48.begin = &end_local;
    local_48.end = &local_30;
    local_48.this = this;
    slice::anon_class_24_3_cb5dd4a3::operator()(&local_48);
  }
  ArrayView((ArrayView<const_Corrade::Utility::JsonToken> *)&this_local,this->_data + end_local,
            local_30 - end_local);
  return _this_local;
}

Assistant:

constexpr ArrayView<T> ArrayView<T>::slice(std::size_t begin, std::size_t end) const {
    return CORRADE_CONSTEXPR_DEBUG_ASSERT(begin <= end && end <= _size,
            "Containers::ArrayView::slice(): slice ["
            << Utility::Debug::nospace << begin
            << Utility::Debug::nospace << ":"
            << Utility::Debug::nospace << end
            << Utility::Debug::nospace << "] out of range for" << _size
            << "elements"),
        ArrayView<T>{_data + begin, end - begin};
}